

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

int Bac_ManClpObjNum_rec(Bac_Ntk_t *p)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Bac_Ntk_t *p_00;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  
  iVar9 = p->Count;
  if (iVar9 < 0) {
    uVar2 = (p->vType).nSize;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      iVar9 = 0;
    }
    else {
      pcVar8 = (p->vType).pArray;
      lVar14 = 0;
      iVar15 = -1;
      uVar13 = 1;
      iVar9 = 0;
      do {
        if (0xffffffbb < ((byte)pcVar8[lVar14] >> 1) - 0x49) {
          if ((pcVar8[lVar14] & 0xfeU) == 10) {
            if ((p->vFanin).nSize <= lVar14) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar4 = (p->vFanin).pArray[lVar14];
            if (((long)iVar4 < 1) || (p->pDesign->nNtks < iVar4)) {
              p_00 = (Bac_Ntk_t *)0x0;
            }
            else {
              p_00 = p->pDesign->pNtks + iVar4;
            }
            iVar5 = Bac_ManClpObjNum_rec(p_00);
            iVar4 = (p->vType).nSize;
            uVar7 = (ulong)iVar4;
            if ((long)uVar7 <= lVar14) {
LAB_003bb72b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            pcVar8 = (p->vType).pArray;
            if (((byte)pcVar8[lVar14] >> 1) - 0x49 < 0xffffffbc) {
              __assert_fail("Bac_ObjIsBox(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                            ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
            }
            uVar12 = uVar13;
            iVar10 = iVar15;
            do {
              iVar11 = iVar4 + -1;
              if (uVar7 <= uVar12) break;
              pbVar1 = (byte *)(pcVar8 + uVar12);
              iVar11 = iVar10 + 1;
              uVar12 = uVar12 + 1;
              iVar10 = iVar11;
            } while ((*pbVar1 & 0xfe) == 8);
            iVar5 = (iVar11 - (int)lVar14) * 3 + iVar5;
          }
          else {
            lVar6 = lVar14;
            do {
              if (lVar6 < 1) {
                iVar4 = 1;
                goto LAB_003bb678;
              }
              if ((uint)uVar7 <= (int)lVar14 - 1U) goto LAB_003bb72b;
              lVar3 = lVar6 + -1;
              lVar6 = lVar6 + -1;
            } while ((pcVar8[lVar3] & 0xfeU) == 6);
            iVar4 = -(int)lVar6;
LAB_003bb678:
            uVar12 = uVar13;
            iVar10 = iVar15;
            do {
              iVar5 = (uint)uVar7 - 1;
              if ((uVar7 & 0xffffffff) <= uVar12) break;
              pbVar1 = (byte *)(pcVar8 + uVar12);
              iVar10 = iVar10 + 1;
              uVar12 = uVar12 + 1;
              iVar5 = iVar10;
            } while ((*pbVar1 & 0xfe) == 8);
            iVar5 = iVar5 + iVar4;
          }
          iVar9 = iVar9 + iVar5;
        }
        lVar14 = lVar14 + 1;
        iVar15 = iVar15 + 1;
        uVar13 = uVar13 + 1;
      } while (lVar14 < (int)uVar7);
    }
    p->Count = iVar9;
  }
  return iVar9;
}

Assistant:

int Bac_ManClpObjNum_rec( Bac_Ntk_t * p )
{
    int i, Counter = 0;
    if ( p->Count >= 0 )
        return p->Count;
    Bac_NtkForEachBox( p, i )
        Counter += Bac_ObjIsBoxUser(p, i) ? Bac_ManClpObjNum_rec( Bac_BoxNtk(p, i) ) + 3*Bac_BoxBoNum(p, i) : Bac_BoxSize(p, i);
    return (p->Count = Counter);
}